

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

void Cbs0_ManAssign(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t **ppGVar3;
  Gia_Obj_t *pGVar4;
  
  pGVar4 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar2 = (uint)*(ulong *)pGVar4;
  if (((~uVar2 & 0x9fffffff) != 0) && ((int)uVar2 < 0 || (~uVar2 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1bf,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if ((uVar2 >> 0x1e & 1) == 0) {
    *(ulong *)pGVar4 =
         (*(ulong *)pGVar4 & 0xbfffffffbfffffff | (ulong)((uint)pObj & 1) << 0x3e) ^
         0x4000000040000000;
    iVar1 = (p->pProp).nSize;
    if ((p->pProp).iTail == iVar1) {
      (p->pProp).nSize = iVar1 * 2;
      ppGVar3 = (p->pProp).pData;
      if (ppGVar3 == (Gia_Obj_t **)0x0) {
        ppGVar3 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
      }
      else {
        ppGVar3 = (Gia_Obj_t **)realloc(ppGVar3,(long)iVar1 << 4);
      }
      (p->pProp).pData = ppGVar3;
    }
    iVar1 = (p->pProp).iTail;
    (p->pProp).iTail = iVar1 + 1;
    (p->pProp).pData[iVar1] = pGVar4;
    return;
  }
  __assert_fail("!Cbs0_VarIsAssigned(pObjR)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                ,0x1c0,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Cbs0_ManAssign( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs0_VarIsAssigned(pObjR) );
    Cbs0_VarAssign( pObjR );
    Cbs0_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    Cbs0_QuePush( &p->pProp, pObjR );
}